

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void action_key(tgestate_t *state,room_t room_of_key)

{
  byte *pbVar1;
  byte bVar2;
  message_t message_index;
  
  pbVar1 = get_nearest_door(state);
  if (pbVar1 != (byte *)0x0) {
    message_index = message_INCORRECT_KEY;
    if ((*pbVar1 & 0x7f) == room_of_key) {
      *pbVar1 = room_of_key;
      bVar2 = 0x66;
      if (state->morale < 0x66) {
        bVar2 = state->morale;
      }
      state->morale = bVar2 + 10;
      increase_score(state,'2');
      message_index = message_IT_IS_OPEN;
    }
    queue_message(state,message_index);
    return;
  }
  return;
}

Assistant:

void action_key(tgestate_t *state, room_t room_of_key)
{
  doorindex_t *pdoor;   /* was HL */
  message_t    message; /* was B */

  assert(state != NULL);
  ASSERT_ROOM_VALID(room_of_key);

  pdoor = get_nearest_door(state);
  if (pdoor == NULL)
    return; /* No door nearby. */

  if ((*pdoor & ~door_LOCKED) != room_of_key)
  {
    message = message_INCORRECT_KEY;
  }
  else
  {
    *pdoor &= ~door_LOCKED; /* Unlock. */
    increase_morale_by_10_score_by_50(state);
    message = message_IT_IS_OPEN;
  }

  queue_message(state, message);
}